

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O2

bool __thiscall slang::SourceManager::isFileLoc(SourceManager *this,SourceLocation location)

{
  FileInfo *pFVar1;
  BufferID buffer;
  bool bVar2;
  shared_lock<std::shared_mutex> lock;
  shared_lock<std::shared_mutex> local_28;
  
  buffer.id = location._0_4_ & 0xfffffff;
  if (buffer.id == 0xfffffff) {
    bVar2 = false;
  }
  else {
    local_28._M_owns = true;
    local_28._M_pm = &this->mutex;
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
    pFVar1 = getFileInfo<std::shared_lock<std::shared_mutex>_>(this,buffer,&local_28);
    bVar2 = pFVar1 != (FileInfo *)0x0;
    std::shared_lock<std::shared_mutex>::~shared_lock(&local_28);
  }
  return bVar2;
}

Assistant:

bool SourceManager::isFileLoc(SourceLocation location) const {
    if (location.buffer() == SourceLocation::NoLocation.buffer())
        return false;

    std::shared_lock<std::shared_mutex> lock(mutex);
    return getFileInfo(location.buffer(), lock) != nullptr;
}